

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

void __thiscall
BasicContainer::build
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list,
          treenode **cur)

{
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  __first;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  __last;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  __last_00;
  pointer ppBVar1;
  size_type sVar2;
  reference ppBVar3;
  ulong uVar4;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  _Var5;
  BasicPrimitive **ppBVar6;
  reference pvVar7;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *in_RDX;
  BasicContainer *in_RSI;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int i_3;
  int best;
  int rangemax;
  int rangemin;
  int i_2;
  int i_1;
  AABox accu;
  vector<float,_std::allocator<float>_> suffix_area;
  vector<float,_std::allocator<float>_> prefix_area;
  _func_bool_BasicPrimitive_ptr_BasicPrimitive_ptr *cmp;
  int i;
  AABox *bound;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *in_stack_fffffffffffffd68;
  difference_type in_stack_fffffffffffffd70;
  undefined1 *__n;
  undefined4 in_stack_fffffffffffffd78;
  value_type in_stack_fffffffffffffd7c;
  value_type in_stack_fffffffffffffd80;
  float in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  allocator_type *__a;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *this_00;
  float in_stack_fffffffffffffda8;
  float in_stack_fffffffffffffdac;
  undefined1 local_1d1;
  BasicPrimitive **local_1d0;
  BasicPrimitive **local_1c8;
  BasicPrimitive **local_1c0;
  BasicPrimitive **local_1b8;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  undefined1 local_188 [24];
  AABox local_170;
  int local_158;
  AABox local_154;
  undefined1 local_13c [24];
  AABox local_124;
  int local_10c;
  AABox local_108;
  vector<float,_std::allocator<float>_> local_e8;
  vector<float,_std::allocator<float>_> local_d0;
  BasicPrimitive **local_b8;
  BasicPrimitive **local_b0;
  _lambda_BasicPrimitive__BasicPrimitive___3_ local_a3;
  _lambda_BasicPrimitive__BasicPrimitive___2_ local_a2;
  _lambda_BasicPrimitive__BasicPrimitive___1_ local_a1;
  _func_bool_BasicPrimitive_ptr_BasicPrimitive_ptr *local_a0;
  undefined1 local_94 [24];
  BasicPrimitive *local_7c;
  BasicPrimitive *local_74;
  BasicPrimitive *local_6c;
  int local_64;
  BasicPrimitive *local_60;
  BasicPrimitive *local_58;
  BasicPrimitive *local_50;
  pointer local_48;
  BasicPrimitive *local_3c;
  BasicPrimitive *local_34;
  BasicPrimitive *local_2c;
  treenode **in_stack_ffffffffffffffe0;
  BasicContainer *this_01;
  
  this_01 = in_RSI;
  if ((in_RDX->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    ppBVar1 = (pointer)operator_new(0x30);
    ppBVar1[4] = (BasicPrimitive *)0x0;
    ppBVar1[5] = (BasicPrimitive *)0x0;
    ppBVar1[2] = (BasicPrimitive *)0x0;
    ppBVar1[3] = (BasicPrimitive *)0x0;
    *ppBVar1 = (BasicPrimitive *)0x0;
    ppBVar1[1] = (BasicPrimitive *)0x0;
    treenode::treenode((treenode *)0x180127);
    (in_RDX->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
    super__Vector_impl_data._M_start = ppBVar1;
  }
  sVar2 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
                    ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI);
  if (sVar2 == 1) {
    ppBVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                        ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI,0);
    (in_RDX->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
    super__Vector_impl_data._M_start[2] = *ppBVar3;
    ppBVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                        ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI,0);
    (*((*ppBVar3)->super_Primitive)._vptr_Primitive[1])(&local_3c);
    ppBVar1 = (in_RDX->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppBVar1[3] = local_3c;
    ppBVar1[4] = local_34;
    ppBVar1[5] = local_2c;
  }
  else {
    local_48 = (in_RDX->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
               _M_impl.super__Vector_impl_data._M_start + 3;
    ppBVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                        ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI,0);
    (*((*ppBVar3)->super_Primitive)._vptr_Primitive[1])(&local_60);
    *local_48 = local_60;
    local_48[1] = local_58;
    local_48[2] = local_50;
    local_64 = 1;
    while( true ) {
      uVar4 = (ulong)local_64;
      sVar2 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
                        ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI);
      if (sVar2 <= uVar4) break;
      ppBVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                          ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI,
                           (long)local_64);
      (*((*ppBVar3)->super_Primitive)._vptr_Primitive[1])(local_94);
      ::operator+((AABox *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                  (AABox *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      *local_48 = local_7c;
      local_48[1] = local_74;
      local_48[2] = local_6c;
      local_64 = local_64 + 1;
    }
    local_a0 = build(std::vector,BasicContainer::treenode*&)::
               {lambda(BasicPrimitive*,BasicPrimitive*)#1}::operator_cast_to_function_pointer
                         (&local_a1);
    if (*(float *)((long)local_48 + 4) - *(float *)local_48 <
        *(float *)((long)local_48 + 0xc) - *(float *)(local_48 + 1)) {
      local_a0 = build(std::vector,BasicContainer::treenode*&)::
                 {lambda(BasicPrimitive*,BasicPrimitive*)#2}::operator_cast_to_function_pointer
                           (&local_a2);
    }
    if ((*(float *)((long)local_48 + 4) - *(float *)local_48 <
         *(float *)((long)local_48 + 0x14) - *(float *)(local_48 + 2)) &&
       (*(float *)((long)local_48 + 0xc) - *(float *)(local_48 + 1) <
        *(float *)((long)local_48 + 0x14) - *(float *)(local_48 + 2))) {
      local_a0 = build(std::vector,BasicContainer::treenode*&)::
                 {lambda(BasicPrimitive*,BasicPrimitive*)#3}::operator_cast_to_function_pointer
                           (&local_a3);
    }
    local_b0 = (BasicPrimitive **)
               std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::begin
                         (in_stack_fffffffffffffd68);
    local_b8 = (BasicPrimitive **)
               std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::end
                         (in_stack_fffffffffffffd68);
    __first._M_current._4_4_ = in_stack_fffffffffffffd94;
    __first._M_current._0_4_ = in_stack_fffffffffffffd90;
    _Var5._M_current._4_4_ = in_stack_fffffffffffffd8c;
    _Var5._M_current._0_4_ = in_stack_fffffffffffffd88;
    std::
    sort<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,bool(*)(BasicPrimitive*,BasicPrimitive*)>
              (__first,_Var5,
               (_func_bool_BasicPrimitive_ptr_BasicPrimitive_ptr *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x180440);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x18044d);
    std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
              ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
              ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    ppBVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                        ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI,0);
    (*((*ppBVar3)->super_Primitive)._vptr_Primitive[1])(&local_108);
    local_10c = 0;
    while( true ) {
      _Var5._M_current = (BasicPrimitive **)(long)local_10c;
      ppBVar6 = (BasicPrimitive **)
                std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
                          ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI);
      if (ppBVar6 <= _Var5._M_current) break;
      ppBVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                          ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI,
                           (long)local_10c);
      (*((*ppBVar3)->super_Primitive)._vptr_Primitive[1])(local_13c);
      ::operator+((AABox *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                  (AABox *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_108.z1 = local_124.z1;
      local_108.z2 = local_124.z2;
      local_108.x1 = local_124.x1;
      local_108.x2 = local_124.x2;
      local_108.y1 = local_124.y1;
      local_108.y2 = local_124.y2;
      in_stack_fffffffffffffdac = AABox::surfaceArea(&local_108);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_d0,(long)local_10c);
      *pvVar7 = in_stack_fffffffffffffdac;
      local_10c = local_10c + 1;
    }
    sVar2 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
                      ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI);
    ppBVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                        ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI,
                         sVar2 - 1);
    (*((*ppBVar3)->super_Primitive)._vptr_Primitive[1])(&local_154);
    local_108.x1 = local_154.x1;
    local_108.x2 = local_154.x2;
    local_108.y1 = local_154.y1;
    local_108.y2 = local_154.y2;
    local_108.z1 = local_154.z1;
    local_108.z2 = local_154.z2;
    sVar2 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
                      ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI);
    local_158 = (int)sVar2;
    while (local_158 = local_158 + -1, -1 < local_158) {
      ppBVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                          ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI,
                           (long)local_158);
      (*((*ppBVar3)->super_Primitive)._vptr_Primitive[1])(local_188);
      ::operator+((AABox *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                  (AABox *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_108.z1 = local_170.z1;
      local_108.z2 = local_170.z2;
      local_108.x1 = local_170.x1;
      local_108.x2 = local_170.x2;
      local_108.y1 = local_170.y1;
      local_108.y2 = local_170.y2;
      in_stack_fffffffffffffda8 = AABox::surfaceArea(&local_108);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_e8,(long)local_158);
      *pvVar7 = in_stack_fffffffffffffda8;
    }
    sVar2 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
                      ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI);
    uVar11 = 0x43300000;
    uVar12 = 0x45300000;
    auVar9._8_4_ = (int)(sVar2 >> 0x20);
    auVar9._0_8_ = sVar2;
    auVar9._12_4_ = 0x45300000;
    __a = (allocator_type *)0x4330000000000000;
    this_00 = (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)0x4530000000000000;
    dVar8 = round(((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * 0.15);
    local_18c = (int)dVar8;
    sVar2 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
                      ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)in_RSI);
    auVar10._8_4_ = (int)(sVar2 >> 0x20);
    auVar10._0_8_ = sVar2;
    auVar10._12_4_ = uVar12;
    dVar8 = round(((auVar10._8_8_ - (double)this_00) +
                  ((double)CONCAT44(uVar11,(int)sVar2) - (double)__a)) * 0.85);
    local_190 = (int)(dVar8 - 1.0);
    local_194 = local_18c;
    for (local_198 = local_18c; local_198 < local_190; local_198 = local_198 + 1) {
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_d0,(long)local_198);
      in_stack_fffffffffffffd7c = *pvVar7;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_e8,(long)(local_198 + 1));
      in_stack_fffffffffffffd84 = in_stack_fffffffffffffd7c + *pvVar7;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_d0,(long)local_194);
      in_stack_fffffffffffffd80 = *pvVar7;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_e8,(long)(local_194 + 1));
      if (in_stack_fffffffffffffd84 < in_stack_fffffffffffffd80 + *pvVar7) {
        local_194 = local_198;
      }
    }
    local_1b8 = (BasicPrimitive **)
                std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::begin
                          (in_stack_fffffffffffffd68);
    local_1d0 = (BasicPrimitive **)
                std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::begin
                          (in_stack_fffffffffffffd68);
    local_1c8 = (BasicPrimitive **)
                __gnu_cxx::
                __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                ::operator+((__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                            in_stack_fffffffffffffd70);
    local_1c0 = (BasicPrimitive **)
                __gnu_cxx::
                __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                ::operator+((__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                            in_stack_fffffffffffffd70);
    __n = &local_1d1;
    std::allocator<BasicPrimitive_*>::allocator((allocator<BasicPrimitive_*> *)0x1808dc);
    __last._M_current._4_4_ = in_stack_fffffffffffffdac;
    __last._M_current._0_4_ = in_stack_fffffffffffffda8;
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              (this_00,_Var5,__last,__a);
    build(this_01,in_RDX,in_stack_ffffffffffffffe0);
    std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~vector
              ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::allocator<BasicPrimitive_*>::~allocator((allocator<BasicPrimitive_*> *)0x180939);
    std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::begin
              (in_stack_fffffffffffffd68);
    __gnu_cxx::
    __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
    ::operator+((__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                (difference_type)__n);
    __gnu_cxx::
    __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
    ::operator+((__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                (difference_type)__n);
    std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::end(in_stack_fffffffffffffd68)
    ;
    std::allocator<BasicPrimitive_*>::allocator((allocator<BasicPrimitive_*> *)0x1809a5);
    __last_00._M_current._4_4_ = in_stack_fffffffffffffdac;
    __last_00._M_current._0_4_ = in_stack_fffffffffffffda8;
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              (this_00,_Var5,__last_00,__a);
    build(this_01,in_RDX,in_stack_ffffffffffffffe0);
    std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~vector
              ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::allocator<BasicPrimitive_*>::~allocator((allocator<BasicPrimitive_*> *)0x180a05);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  }
  return;
}

Assistant:

void build(std::vector<BasicPrimitive*> list, treenode*& cur)
	{
		// create tree node
		if (!cur) {
			cur = new treenode();
		}
		// bind shape to leaf nodes
		if (list.size() == 1)
		{
			cur->shape = list[0];
			cur->bound = list[0]->boundingVolume();
			return;
		}
		// compute bounding box
		AABox& bound = cur->bound;
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
		// sort in sparsest dimension
		auto cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
			return a->boundingVolume().x1 < b->boundingVolume().x1;
		};
		if (bound.y2 - bound.y1 > bound.x2 - bound.x1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().y1 < b->boundingVolume().y1;
			};
		}
		if (bound.z2 - bound.z1 > bound.x2 - bound.x1 &&
			bound.z2 - bound.z1 > bound.y2 - bound.y1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().z1 < b->boundingVolume().z1;
			};
		}
		std::sort(list.begin(), list.end(), cmp);
		// determine split position to minimize sum of surface area of bounding boxes
		std::vector<float> prefix_area, suffix_area;
		prefix_area.resize(list.size());
		suffix_area.resize(list.size());
		AABox accu = list[0]->boundingVolume();
		for (int i=0; i<list.size(); ++i) {
			accu = accu + list[i]->boundingVolume();
			prefix_area[i] = accu.surfaceArea();
		}
		accu = list[list.size()-1]->boundingVolume();
		for (int i=list.size()-1; i>=0; --i) {
			accu = accu + list[i]->boundingVolume();
			suffix_area[i] = accu.surfaceArea();
		}
		int rangemin = round(list.size()*0.15);
		int rangemax = round(list.size()*0.85)-1;
		// limit split point from being too close to side
		int best = rangemin;
		for (int i=rangemin; i<rangemax; ++i) {
			if (prefix_area[i] + suffix_area[i+1] < prefix_area[best] + suffix_area[best+1])
				best = i;
		}
		// recursive partition
		build(std::vector<BasicPrimitive*>(list.begin(), list.begin()+best+1), cur->lc);
		build(std::vector<BasicPrimitive*>(list.begin()+best+1, list.end()), cur->rc);
	}